

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNABase::SetReg(OPNABase *this,uint addr,uint data)

{
  byte bVar1;
  uint32 uVar2;
  long lVar3;
  uint8 data_00;
  uint uVar4;
  uint f;
  ulong uVar6;
  ulong uVar5;
  
  uVar4 = addr & 3;
  uVar5 = (ulong)uVar4;
  data_00 = (uint8)data;
  switch(addr) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    PSG::SetReg(&(this->super_OPNBase).psg,addr,data_00);
    return;
  case 0x22:
    bVar1 = this->reg22;
    this->reg22 = data_00;
    if (((bVar1 ^ data) & 8) != 0) {
      this->lfocount = 0;
    }
    uVar2 = 0;
    if ((data & 8) != 0) {
      uVar2 = (&OPNBase::lfotable)[data & 7];
    }
    this->lfodcount = uVar2;
    return;
  case 0x24:
  case 0x25:
    Timer::SetTimerA((Timer *)this,addr,data);
    return;
  case 0x26:
    Timer::SetTimerB((Timer *)this,data);
    return;
  case 0x27:
    Timer::SetTimerControl((Timer *)this,data);
    return;
  case 0x28:
    if ((data & 3) != 3) {
      Channel4::KeyControl
                ((Channel4 *)
                 (this->adpcmreg +
                 (ulong)(((int)(data << 0x1d) >> 0x1f & 3U) + (data & 3)) * 0x2e0 + 0xf),data >> 4);
      return;
    }
    break;
  case 0x29:
    this->reg29 = data;
    return;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    OPNBase::SetPrescaler(&this->super_OPNBase,addr - 0x2d);
    return;
  default:
    switch(addr) {
    case 0xa0:
    case 0xa1:
    case 0xa2:
switchD_00173837_caseD_a0:
      f = (uint)this->fnum2[uVar5] * 0x100 + data;
      this->fnum[uVar5] = f;
      Channel4::SetFNum((Channel4 *)(this->adpcmreg + uVar5 * 0x2e0 + 0xf),f);
      return;
    case 0xa3:
    case 0xa7:
    case 0xab:
    case 0xaf:
    case 0xb3:
      break;
    case 0xa4:
    case 0xa5:
    case 0xa6:
switchD_00173837_caseD_a4:
      this->fnum2[uVar5] = data_00;
      return;
    case 0xa8:
    case 0xa9:
    case 0xaa:
      this->fnum3[uVar5] = (uint)this->fnum2[uVar5 + 6] * 0x100 + data;
      return;
    case 0xac:
    case 0xad:
    case 0xae:
      this->fnum2[uVar5 + 6] = data_00;
      return;
    case 0xb0:
    case 0xb1:
    case 0xb2:
switchD_00173837_caseD_b0:
      ((Channel4 *)(this->adpcmreg + uVar5 * 0x2e0 + 0xf))->fb =
           (uint)*(byte *)((long)&Channel4::fbtable + (ulong)(data >> 3 & 7));
      Channel4::SetAlgorithm((Channel4 *)(this->adpcmreg + uVar5 * 0x2e0 + 0xf),data & 7);
      return;
    case 0xb4:
    case 0xb5:
    case 0xb6:
switchD_00173837_caseD_b4:
      this->pan[uVar4] = (byte)(data >> 6) & 3;
      lVar3 = (ulong)uVar4 * 0x2e0;
      *(uint *)(&this->field_0x348 + lVar3) = data;
      (&this->field_0x372)[lVar3] = 1;
      *(uint *)(&this->field_0x3e8 + lVar3) = data;
      (&this->field_0x412)[lVar3] = 1;
      *(uint *)(&this->field_0x488 + lVar3) = data;
      (&this->field_0x4b2)[lVar3] = 1;
      *(uint *)(&this->field_0x528 + lVar3) = data;
      (&this->field_0x552)[lVar3] = 1;
      return;
    default:
      switch(addr) {
      case 0x1a0:
      case 0x1a1:
      case 0x1a2:
        uVar5 = (ulong)(uVar4 + 3);
        goto switchD_00173837_caseD_a0;
      case 0x1a4:
      case 0x1a5:
      case 0x1a6:
        uVar5 = (ulong)(uVar4 + 3);
        goto switchD_00173837_caseD_a4;
      case 0x1b0:
      case 0x1b1:
      case 0x1b2:
        uVar5 = (ulong)(uVar4 + 3);
        goto switchD_00173837_caseD_b0;
      case 0x1b4:
      case 0x1b5:
      case 0x1b6:
        uVar4 = uVar4 + 3;
        goto switchD_00173837_caseD_b4;
      }
    }
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x2a:
  case 0x2b:
  case 0x2c:
    if (uVar4 != 3) {
      uVar6 = (ulong)(uVar4 + 3);
      if ((addr >> 8 & 1) == 0) {
        uVar6 = uVar5;
      }
      OPNBase::SetParameter
                (&this->super_OPNBase,(Channel4 *)(this->adpcmreg + uVar6 * 0x2e0 + 0xf),addr,data);
      return;
    }
  }
  return;
}

Assistant:

void OPNABase::SetReg(uint addr, uint data)
{
	int	c = addr & 3;
	switch (addr)
	{
		uint modified;

	// Timer -----------------------------------------------------------------
		case 0x24: case 0x25:
			SetTimerA(addr, data);
			break;

		case 0x26:
			SetTimerB(data);
			break;

		case 0x27:
			SetTimerControl(data);
			break;

	// Misc ------------------------------------------------------------------
	case 0x28:		// Key On/Off
		if ((data & 3) < 3)
		{
			c = (data & 3) + (data & 4 ? 3 : 0);
			ch[c].KeyControl(data >> 4);
		}
		break;

	// Status Mask -----------------------------------------------------------
	case 0x29:
		reg29 = data;
//		UpdateStatus(); //?
		break;

	// Prescaler -------------------------------------------------------------
	case 0x2d: case 0x2e: case 0x2f:
		SetPrescaler(addr-0x2d);
		break;

	// F-Number --------------------------------------------------------------
	case 0x1a0:	case 0x1a1: case 0x1a2:
		c += 3;
		// fall through
	case 0xa0:	case 0xa1: case 0xa2:
		fnum[c] = data + fnum2[c] * 0x100;
		ch[c].SetFNum(fnum[c]);
		break;

	case 0x1a4:	case 0x1a5: case 0x1a6:
		c += 3;
		// fall through
	case 0xa4 : case 0xa5: case 0xa6:
		fnum2[c] = uint8(data);
		break;

	case 0xa8:	case 0xa9: case 0xaa:
		fnum3[c] = data + fnum2[c+6] * 0x100;
		break;

	case 0xac : case 0xad: case 0xae:
		fnum2[c+6] = uint8(data);
		break;

	// Algorithm -------------------------------------------------------------

	case 0x1b0:	case 0x1b1:  case 0x1b2:
		c += 3;
		// fall through
	case 0xb0:	case 0xb1:  case 0xb2:
		ch[c].SetFB((data >> 3) & 7);
		ch[c].SetAlgorithm(data & 7);
		break;

	case 0x1b4: case 0x1b5: case 0x1b6:
		c += 3;
		// fall through
	case 0xb4: case 0xb5: case 0xb6:
		pan[c] = (data >> 6) & 3;
		ch[c].SetMS(data);
		break;

	// LFO -------------------------------------------------------------------
	case 0x22:
		modified = reg22 ^ data;
		reg22 = data;
		if (modified & 0x8)
			lfocount = 0;
		lfodcount = reg22 & 8 ? lfotable[reg22 & 7] : 0;
		break;

	// PSG -------------------------------------------------------------------
	case  0: case  1: case  2: case  3: case  4: case  5: case  6: case  7:
	case  8: case  9: case 10: case 11: case 12: case 13: case 14: case 15:
		psg.SetReg(addr, data);
		break;

	// ���F ------------------------------------------------------------------
	default:
		if (c < 3)
		{
			if (addr & 0x100)
				c += 3;
			OPNBase::SetParameter(&ch[c], addr, data);
		}
		break;
	}
}